

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvtable.cc
# Opt level: O1

vector<board::Move,_std::allocator<board::Move>_> * __thiscall
search::PVTable::getPV
          (vector<board::Move,_std::allocator<board::Move>_> *__return_storage_ptr__,PVTable *this,
          Board *pos)

{
  pointer *ppMVar1;
  int iVar2;
  iterator __position;
  bool bVar3;
  Move in_RAX;
  int iVar4;
  Move move;
  Move local_38;
  
  iVar2 = pos->ply;
  (__return_storage_ptr__->super__Vector_base<board::Move,_std::allocator<board::Move>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<board::Move,_std::allocator<board::Move>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<board::Move,_std::allocator<board::Move>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = 0x40;
  local_38 = in_RAX;
  do {
    local_38 = getMove(this,pos);
    if ((local_38.value == 0) || (bVar3 = board::makemove::move(&local_38,pos), !bVar3)) break;
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<board::Move,_std::allocator<board::Move>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<board::Move,_std::allocator<board::Move>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<board::Move,std::allocator<board::Move>>::_M_realloc_insert<board::Move_const&>
                ((vector<board::Move,std::allocator<board::Move>> *)__return_storage_ptr__,
                 __position,&local_38);
    }
    else {
      *__position._M_current = local_38;
      ppMVar1 = &(__return_storage_ptr__->
                 super__Vector_base<board::Move,_std::allocator<board::Move>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  while (iVar2 < pos->ply) {
    board::makemove::undo(pos);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<board::Move> search::PVTable::getPV(board::Board& pos)
{
    int originalPly = pos.getPly();
    std::vector<board::Move> pv;
    for (int i = 0; i < 64; i++) {
        board::Move move = getMove(pos);
        if (move.getValue() != 0 && board::makemove::move(move, pos)) {
            pv.push_back(move);
        }
        else {
            break;
        }
    }
    while (pos.getPly() > originalPly) {
        board::makemove::undo(pos);
    }
    return pv;
}